

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextClassifier.pb.cc
# Opt level: O3

void __thiscall
CoreML::Specification::CoreMLModels::TextClassifier::clear_ClassLabels(TextClassifier *this)

{
  ulong uVar1;
  StringVector *this_00;
  undefined8 *puVar2;
  
  if (this->_oneof_case_[0] == 200) {
    uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
    puVar2 = (undefined8 *)(uVar1 & 0xfffffffffffffffc);
    if ((uVar1 & 1) != 0) {
      puVar2 = (undefined8 *)*puVar2;
    }
    if (puVar2 == (undefined8 *)0x0) {
      this_00 = (this->ClassLabels_).stringclasslabels_;
      if (this_00 != (StringVector *)0x0) {
        StringVector::~StringVector(this_00);
      }
      operator_delete(this_00,0x30);
    }
  }
  this->_oneof_case_[0] = 0;
  return;
}

Assistant:

void TextClassifier::clear_ClassLabels() {
// @@protoc_insertion_point(one_of_clear_start:CoreML.Specification.CoreMLModels.TextClassifier)
  switch (ClassLabels_case()) {
    case kStringClassLabels: {
      if (GetArenaForAllocation() == nullptr) {
        delete ClassLabels_.stringclasslabels_;
      }
      break;
    }
    case CLASSLABELS_NOT_SET: {
      break;
    }
  }
  _oneof_case_[0] = CLASSLABELS_NOT_SET;
}